

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

const_iterator __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
::begin(btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
        *this)

{
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *this_00;
  field_type fVar1;
  const_iterator cVar2;
  
  if (((ulong)this->root_ & 7) == 0) {
    this_00 = *(btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                **)this->root_;
    fVar1 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
            ::start(this_00);
    cVar2.position_._0_1_ = fVar1;
    cVar2.node_ = this_00;
    cVar2._9_7_ = 0;
    return cVar2;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 0UL, Char = const char]"
               );
}

Assistant:

const node_type *root() const { return root_; }